

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_> *
__thiscall
google::protobuf::compiler::cpp::anon_unknown_0::ClassVars
          (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *__return_storage_ptr__,anon_unknown_0 *this,Descriptor *desc,Options *opts)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  reference ppVar4;
  Options *opts_00;
  Descriptor *descriptor;
  Descriptor *descriptor_00;
  Descriptor *desc_00;
  long lVar5;
  initializer_list<google::protobuf::io::Printer::Sub> __l;
  iterator iVar6;
  undefined1 local_a5b [2];
  allocator<char> local_a59;
  allocator<char> local_a58;
  allocator<char> local_a57;
  allocator<char> local_a56;
  allocator<char> local_a55;
  allocator<char> local_a54;
  allocator<char> local_a53;
  allocator<char> local_a52;
  allocator<char> local_a51;
  Options *local_a50;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  *local_a48;
  anon_union_8_1_a8a14541_for_iterator_2 local_a40 [4];
  string local_a20;
  undefined1 local_a00 [64];
  string local_9c0;
  string local_9a0;
  string local_980;
  string local_960;
  string local_940;
  string local_920;
  string local_900;
  string local_8e0;
  string local_8c0;
  string local_8a0;
  string local_880;
  string local_860;
  string local_840;
  string local_820;
  Sub local_800;
  string local_748;
  string local_728;
  string_view local_708 [3];
  iterator __begin3;
  Sub local_6a8 [4];
  Sub local_3c8;
  Sub local_310;
  Sub local_258;
  Sub local_1a0;
  Sub local_e8;
  
  local_a48 = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_820,"pkg",&local_a51);
  local_a50 = (Options *)desc;
  Namespace_abi_cxx11_(&local_a20,(cpp *)this,desc,opts);
  io::Printer::Sub::Sub<std::__cxx11::string>(local_6a8,&local_820,&local_a20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_840,"Msg",&local_a52);
  ClassName_abi_cxx11_(&local_860,(cpp *)this,descriptor);
  io::Printer::Sub::Sub<std::__cxx11::string>(local_6a8 + 1,&local_840,&local_860);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_880,"pkg::Msg",&local_a53);
  QualifiedClassName_abi_cxx11_(&local_8a0,(cpp *)this,(Descriptor *)local_a50,opts);
  io::Printer::Sub::Sub<std::__cxx11::string>(local_6a8 + 2,&local_880,&local_8a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c0,"pkg.Msg",&local_a54);
  io::Printer::Sub::Sub<std::__cxx11::string_const&>
            (local_6a8 + 3,&local_8c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (*(long *)(this + 8) + 0x20));
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8e0,"classname",&local_a55);
  ClassName_abi_cxx11_(&local_900,(cpp *)this,descriptor_00);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_3c8,&local_8e0,&local_900);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_920,"classtype",&local_a56);
  QualifiedClassName_abi_cxx11_(&local_940,(cpp *)this,(Descriptor *)local_a50,opts);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_310,&local_920,&local_940);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_960,"full_name",&local_a57);
  io::Printer::Sub::Sub<std::__cxx11::string_const&>
            (&local_258,&local_960,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (*(long *)(this + 8) + 0x20));
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_980,"superclass",&local_a58);
  SuperClassName_abi_cxx11_(&local_9a0,(cpp *)this,(Descriptor *)local_a50,opts);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_1a0,&local_980,&local_9a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9c0,"WeakDescriptorSelfPin",&local_a59);
  bVar3 = UsingImplicitWeakDescriptor(*(FileDescriptor **)(this + 0x10),local_a50);
  if (bVar3) {
    StrongReferenceToType_abi_cxx11_((string *)local_a40,(cpp *)this,(Descriptor *)local_a50,opts);
    __begin3.ctrl_ = (ctrl_t *)local_a40[1];
    __begin3.field_1 = local_a40[0];
    local_708[0] = absl::lts_20240722::NullSafeStringView(";");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_a00,(AlphaNum *)&__begin3);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a00,"",(allocator<char> *)local_a40);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>
            (&local_800,&local_9c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_a00 + 0x20),";",(allocator<char> *)(local_a5b + 1));
  io::Printer::Sub::WithSuffix(&local_e8,&local_800,(string *)(local_a00 + 0x20));
  opts_00 = (Options *)local_a5b;
  __l._M_len = 9;
  __l._M_array = local_6a8;
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  vector(local_a48,__l,(allocator_type *)opts_00);
  lVar5 = 0x5c0;
  do {
    io::Printer::Sub::~Sub((Sub *)((long)&local_6a8[0].key_._M_dataplus._M_p + lVar5));
    lVar5 = lVar5 + -0xb8;
  } while (lVar5 != -0xb8);
  std::__cxx11::string::~string((string *)(local_a00 + 0x20));
  io::Printer::Sub::~Sub(&local_800);
  std::__cxx11::string::~string((string *)local_a00);
  if (bVar3) {
    std::__cxx11::string::~string((string *)local_a40);
  }
  std::__cxx11::string::~string((string *)&local_9c0);
  std::__cxx11::string::~string((string *)&local_9a0);
  std::__cxx11::string::~string((string *)&local_980);
  std::__cxx11::string::~string((string *)&local_960);
  std::__cxx11::string::~string((string *)&local_940);
  std::__cxx11::string::~string((string *)&local_920);
  std::__cxx11::string::~string((string *)&local_900);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::__cxx11::string::~string((string *)&local_8a0);
  std::__cxx11::string::~string((string *)&local_880);
  std::__cxx11::string::~string((string *)&local_860);
  std::__cxx11::string::~string((string *)&local_840);
  std::__cxx11::string::~string((string *)&local_a20);
  std::__cxx11::string::~string((string *)&local_820);
  MessageVars_abi_cxx11_
            ((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_800,(cpp *)this,desc_00);
  __begin3 = absl::lts_20240722::container_internal::
             raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_800);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_708[0]._M_str;
  local_708[0] = (string_view)(auVar1 << 0x40);
  while( true ) {
    bVar3 = absl::lts_20240722::container_internal::operator!=(&__begin3,(iterator *)local_708);
    if (!bVar3) break;
    ppVar4 = absl::lts_20240722::container_internal::
             raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::iterator::operator*(&__begin3);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_728,&ppVar4->first,(allocator<char> *)&local_a20);
    io::Printer::Sub::Sub<std::__cxx11::string&>(local_6a8,&local_728,&ppVar4->second);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::emplace_back<google::protobuf::io::Printer::Sub>(local_a48,local_6a8);
    io::Printer::Sub::~Sub(local_6a8);
    std::__cxx11::string::~string((string *)&local_728);
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::iterator::operator++(&__begin3);
  }
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_800);
  UnknownFieldsVars_abi_cxx11_
            ((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_800,(cpp *)this,(Descriptor *)local_a50,opts_00);
  iVar6 = absl::lts_20240722::container_internal::
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::begin((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_800);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_708[0]._M_str;
  local_708[0] = (string_view)(auVar2 << 0x40);
  __begin3 = iVar6;
  while( true ) {
    bVar3 = absl::lts_20240722::container_internal::operator!=(&__begin3,(iterator *)local_708);
    if (!bVar3) break;
    ppVar4 = absl::lts_20240722::container_internal::
             raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::iterator::operator*(&__begin3);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_748,&ppVar4->first,(allocator<char> *)&local_a20);
    io::Printer::Sub::Sub<std::__cxx11::string&>(local_6a8,&local_748,&ppVar4->second);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::emplace_back<google::protobuf::io::Printer::Sub>(local_a48,local_6a8);
    io::Printer::Sub::~Sub(local_6a8);
    std::__cxx11::string::~string((string *)&local_748);
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::iterator::operator++(&__begin3);
  }
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_800);
  return local_a48;
}

Assistant:

std::vector<Sub> ClassVars(const Descriptor* desc, Options opts) {
  std::vector<Sub> vars = {
      {"pkg", Namespace(desc, opts)},
      {"Msg", ClassName(desc, false)},
      {"pkg::Msg", QualifiedClassName(desc, opts)},
      {"pkg.Msg", desc->full_name()},

      // Old-style names, to be removed once all usages are gone in this and
      // other files.
      {"classname", ClassName(desc, false)},
      {"classtype", QualifiedClassName(desc, opts)},
      {"full_name", desc->full_name()},
      {"superclass", SuperClassName(desc, opts)},

      Sub("WeakDescriptorSelfPin",
          UsingImplicitWeakDescriptor(desc->file(), opts)
              ? absl::StrCat(StrongReferenceToType(desc, opts), ";")
              : "")
          .WithSuffix(";"),
  };

  for (auto& pair : MessageVars(desc)) {
    vars.push_back({std::string(pair.first), pair.second});
  }

  for (auto& pair : UnknownFieldsVars(desc, opts)) {
    vars.push_back({std::string(pair.first), pair.second});
  }

  return vars;
}